

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

void Timidity::PrintArt(char *type,CONNECTIONLIST *art,CONNECTION *artList)

{
  USHORT UVar1;
  char *pcVar2;
  char *pcVar3;
  LONG *pLVar4;
  undefined1 *puVar5;
  char *pcVar6;
  ulong uVar7;
  
  printf("%s Connections:\n",type);
  pLVar4 = &artList->lScale;
  uVar7 = 0;
  do {
    if (art->cConnections <= uVar7) {
      return;
    }
    pcVar2 = SourceToString(((CONNECTION *)(pLVar4 + -2))->usSource);
    pcVar3 = SourceToString(*(USHORT *)((long)pLVar4 + -6));
    UVar1 = *(USHORT *)(pLVar4 + -1);
    pcVar6 = "NONE";
    switch(UVar1) {
    case 0:
      break;
    case 1:
      pcVar6 = "ATTENUATION";
      break;
    case 2:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
switchD_00347166_caseD_30c:
      mysnprintf(DestinationToString(unsigned_short)::unknown,0x20,"UNKNOWN (0x%04x)");
      pcVar6 = DestinationToString(unsigned_short)::unknown;
      break;
    case 3:
      pcVar6 = "PITCH";
      break;
    case 4:
      pcVar6 = "PAN";
      break;
    case 5:
      pcVar6 = "KEYNUMBER";
      break;
    case 0x10:
      pcVar6 = "LEFT";
      break;
    case 0x11:
      pcVar6 = "RIGHT";
      break;
    case 0x12:
      pcVar6 = "CENTER";
      break;
    case 0x13:
      pcVar6 = "LEFTREAR";
      break;
    case 0x14:
      pcVar6 = "RIGHTREAR";
      break;
    case 0x15:
      pcVar6 = "LFE_CHANNEL";
      break;
    default:
      switch(UVar1) {
      case 0x206:
        pcVar6 = "EG1_ATTACKTIME";
        break;
      case 0x207:
        pcVar6 = "EG1_DECAYTIME";
        break;
      case 0x208:
        goto switchD_00347166_caseD_30c;
      case 0x209:
        pcVar6 = "EG1_RELEASETIME";
        break;
      case 0x20a:
        pcVar6 = "EG1_SUSTAINLEVEL";
        break;
      case 0x20b:
        pcVar6 = "EG1_DELAYTIME";
        break;
      case 0x20c:
        pcVar6 = "EG1_HOLDTIME";
        break;
      case 0x20d:
        pcVar6 = "EG1_SHUTDOWNTIME";
        break;
      default:
        switch(UVar1) {
        case 0x30a:
          pcVar6 = "EG2_ATTACKTIME";
          break;
        case 0x30b:
          pcVar6 = "EG2_DECAYTIME";
          break;
        case 0x30c:
          goto switchD_00347166_caseD_30c;
        case 0x30d:
          pcVar6 = "EG2_RELEASETIME";
          break;
        case 0x30e:
          pcVar6 = "EG2_SUSTAINLEVEL";
          break;
        case 0x30f:
          pcVar6 = "EG2_DELAYTIME";
          break;
        case 0x310:
          pcVar6 = "EG2_HOLDTIME";
          break;
        default:
          if (UVar1 == 0x80) {
            pcVar6 = "CHORUS";
          }
          else if (UVar1 == 0x81) {
            pcVar6 = "REVERB";
          }
          else if (UVar1 == 0x104) {
            pcVar6 = "LFO_FREQUENCY";
          }
          else if (UVar1 == 0x105) {
            pcVar6 = "LFO_STARTDELAY";
          }
          else if (UVar1 == 0x114) {
            pcVar6 = "VIB_FREQUENCY";
          }
          else if (UVar1 == 0x115) {
            pcVar6 = "VIB_STARTDELAY";
          }
          else if (UVar1 == 0x500) {
            pcVar6 = "FILTER_CUTOFF";
          }
          else {
            if (UVar1 != 0x501) goto switchD_00347166_caseD_30c;
            pcVar6 = "FILTER_Q";
          }
        }
      }
    }
    if (*(USHORT *)((long)pLVar4 + -2) < 4) {
      puVar5 = &DAT_005ae430 +
               *(int *)(&DAT_005ae430 + (ulong)(uint)*(USHORT *)((long)pLVar4 + -2) * 4);
    }
    else {
      mysnprintf(TransformToString(unsigned_short)::unknown,0x20,"UNKNOWN (0x%04x)");
      puVar5 = TransformToString(unsigned_short)::unknown;
    }
    printf("  Source: %s, Control: %s, Destination: %s, Transform: %s, Scale: %d\n",pcVar2,pcVar3,
           pcVar6,puVar5,(ulong)(uint)*pLVar4);
    uVar7 = uVar7 + 1;
    pLVar4 = pLVar4 + 3;
  } while( true );
}

Assistant:

static void PrintArt(const char *type, CONNECTIONLIST *art, CONNECTION *artList)
{
	DWORD i;
	printf("%s Connections:\n", type);
	for ( i = 0; i < art->cConnections; ++i ) {
		printf("  Source: %s, Control: %s, Destination: %s, Transform: %s, Scale: %d\n",
			SourceToString(artList[i].usSource),
			SourceToString(artList[i].usControl),
			DestinationToString(artList[i].usDestination),
			TransformToString(artList[i].usTransform),
			artList[i].lScale);
	}
}